

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSFixed32
               (int field_number,int32 value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int32 value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_FIXED32,output);
  WriteSFixed32NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32(int field_number, int32 value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteSFixed32NoTag(value, output);
}